

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interaction.cpp
# Opt level: O1

string * __thiscall
pbrt::Interaction::ToString_abi_cxx11_(string *__return_storage_ptr__,Interaction *this)

{
  MediumInterface *this_00;
  long lVar1;
  char *local_80;
  string local_78;
  string local_58;
  char *local_38;
  
  lVar1 = (this->medium).
          super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::CuboidMedium<pbrt::UniformGridMediumProvider>,_pbrt::CuboidMedium<pbrt::CloudMediumProvider>,_pbrt::CuboidMedium<pbrt::NanoVDBMediumProvider>_>
          .bits << 0x10;
  local_80 = "(nullptr)";
  if (lVar1 != 0) {
    MediumHandle::ToString_abi_cxx11_(&local_58,&this->medium);
    local_80 = local_58._M_dataplus._M_p;
  }
  this_00 = this->mediumInterface;
  local_38 = "(nullptr)";
  if (this_00 != (MediumInterface *)0x0) {
    MediumInterface::ToString_abi_cxx11_(&local_78,this_00);
    local_38 = local_78._M_dataplus._M_p;
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  detail::
  stringPrintfRecursive<pbrt::Point3fi_const&,pbrt::Normal3<float>const&,pbrt::Point2<float>const&,pbrt::Vector3<float>const&,float_const&,char_const*,char_const*>
            (__return_storage_ptr__,
             "[ Interaction pi: %s n: %s uv: %s wo: %s time: %s medium: %s mediumInterface: %s ]",
             &this->pi,&this->n,&this->uv,&this->wo,&this->time,&local_80,&local_38);
  if ((this_00 != (MediumInterface *)0x0) &&
     ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != &local_78.field_2)) {
    operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
  }
  if ((lVar1 != 0) &&
     ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2)) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string Interaction::ToString() const {
    return StringPrintf(
        "[ Interaction pi: %s n: %s uv: %s wo: %s time: %s "
        "medium: %s mediumInterface: %s ]",
        pi, n, uv, wo, time, medium ? medium.ToString().c_str() : "(nullptr)",
        mediumInterface ? mediumInterface->ToString().c_str() : "(nullptr)");
}